

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O0

TestStatus * vkt::api::anon_unknown_1::reportStatus(TestStatus *__return_storage_ptr__,bool success)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  TestStatus *pTStack_10;
  bool success_local;
  
  local_11 = success;
  pTStack_10 = __return_storage_ptr__;
  if (success) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"OK: no observable change",&local_39);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Implementation allocated/freed the memory",&local_71);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus reportStatus (const bool success)
{
	if (success)
		return tcu::TestStatus::pass("OK: no observable change");
	else
		return tcu::TestStatus::fail("Implementation allocated/freed the memory");
}